

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O1

bool __thiscall slang::driver::Driver::processOptions(Driver *this)

{
  Options *this_00;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *poVar1
  ;
  map<slang::ast::CompilationFlags,_std::optional<bool>,_std::less<slang::ast::CompilationFlags>,_std::allocator<std::pair<const_slang::ast::CompilationFlags,_std::optional<bool>_>_>_>
  *this_02;
  DiagnosticEngine *this_03;
  char cVar2;
  pointer pbVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_04;
  TextDiagnosticClient *this_05;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_06;
  bool bVar5;
  bool bVar6;
  int iVar7;
  LanguageVersion LVar8;
  _Storage<unsigned_int,_true> _Var9;
  optional<slang::TimeScale> oVar10;
  iterator __end4;
  mapped_type *pmVar11;
  JsonWriter *pJVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  JsonDiagnosticClient *__tmp;
  basic_string_view<char,_std::char_traits<char>_> *pbVar14;
  DiagnosticSeverity severity;
  char *in_RDX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  Diagnostic *diag;
  Diagnostic *diagnostic;
  ShowHierarchyPathOption SVar15;
  DiagCode code;
  Diagnostic *ctx;
  pointer *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  long lVar16;
  iterator __begin3;
  pointer message;
  pointer pbVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_07;
  bool bVar18;
  string_view str;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view str_00;
  string_view fmt_04;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
  options;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  parts;
  Diagnostics optionDiags;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_150;
  vector<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>>
  *local_148;
  undefined1 local_140 [16];
  Diagnostic local_130 [2];
  pointer local_48;
  size_type sStack_40;
  
  if ((this->options).colorDiags.super__Optional_base<bool,_true,_true>._M_payload.
      super__Optional_payload_base<bool>._M_engaged == true) {
    bVar6 = (this->options).colorDiags.super__Optional_base<bool,_true,_true>._M_payload.
            super__Optional_payload_base<bool>._M_payload._M_value;
  }
  else {
    bVar6 = OS::fileSupportsColors(_stderr);
    in_RDX = extraout_RDX;
  }
  if (bVar6 != false) {
    OS::showColorsStderr = true;
    bVar5 = OS::fileSupportsColors(_stdout);
    in_RDX = extraout_RDX_00;
    if (bVar5) {
      OS::showColorsStdout = true;
    }
  }
  if ((this->options).languageVersion.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    this_00 = &this->options;
    iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                       "1800-2017");
    if (iVar7 == 0) {
      LVar8 = Default;
      in_RDX = extraout_RDX_01;
LAB_0064b3e7:
      this->languageVersion = LVar8;
      goto LAB_0064b3ed;
    }
    if ((((this->options).languageVersion.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged == true) &&
        (iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         this_00,"1800-2023"), in_RDX = extraout_RDX_02, iVar7 == 0)) ||
       (((this->options).languageVersion.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_engaged == true &&
        (iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         this_00,"latest"), in_RDX = extraout_RDX_03, iVar7 == 0)))) {
      LVar8 = v1800_2023;
      goto LAB_0064b3e7;
    }
    local_178.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         *(pointer *)
          &(this->options).languageVersion.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload._M_value._M_dataplus;
    local_178.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         *(pointer *)
          ((long)&(this->options).languageVersion.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_payload + 8);
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x24;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_178;
    ::fmt::v11::vformat_abi_cxx11_
              ((string *)local_140,(v11 *)"invalid value for --std option: \'{}\'",fmt,args);
    printError(this,(string *)local_140);
  }
  else {
LAB_0064b3ed:
    this_01 = &(this->options).compat;
    if ((this->options).compat.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged == true) {
      iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                      "vcs");
      if (iVar7 != 0) {
        local_178.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)(this->options).compat.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._M_value._M_dataplus._M_p;
        local_178.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             *(pointer *)
              ((long)&(this->options).compat.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload + 8);
        fmt_00.size_ = 0xd;
        fmt_00.data_ = (char *)0x25;
        args_00.field_1.args_ = in_R9.args_;
        args_00.desc_ = (unsigned_long_long)&local_178;
        ::fmt::v11::vformat_abi_cxx11_
                  ((string *)local_140,(v11 *)"invalid value for compat option: \'{}\'",fmt_00,
                   args_00);
        printError(this,(string *)local_140);
        goto LAB_0064b66f;
      }
      lVar16 = 0;
      do {
        local_140._0_4_ = *(undefined4 *)((long)&DAT_00a5e070 + lVar16);
        pmVar11 = std::
                  map<slang::ast::CompilationFlags,_std::optional<bool>,_std::less<slang::ast::CompilationFlags>,_std::allocator<std::pair<const_slang::ast::CompilationFlags,_std::optional<bool>_>_>_>
                  ::at(&(this->options).compilationFlags,(key_type *)local_140);
        if ((pmVar11->super__Optional_base<bool,_true,_true>)._M_payload.
            super__Optional_payload_base<bool>._M_engaged == false) {
          (pmVar11->super__Optional_base<bool,_true,_true>)._M_payload.
          super__Optional_payload_base<bool> = (_Optional_payload_base<bool>)0x101;
        }
        lVar16 = lVar16 + 4;
        in_RDX = extraout_RDX_04;
      } while (lVar16 != 0x24);
    }
    if ((this->options).minTypMax.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged == true) {
      poVar1 = &(this->options).minTypMax;
      iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)poVar1,
                      "min");
      in_RDX = extraout_RDX_05;
      if (((iVar7 != 0) &&
          (((this->options).minTypMax.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged != true ||
           (iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              poVar1,"typ"), in_RDX = extraout_RDX_06, iVar7 != 0)))) &&
         (((this->options).minTypMax.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_engaged != true ||
          (iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           poVar1,"max"), in_RDX = extraout_RDX_07, iVar7 != 0)))) {
        local_178.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)(this->options).minTypMax.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._M_value._M_dataplus._M_p;
        local_178.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             *(pointer *)
              ((long)&(this->options).minTypMax.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload + 8);
        fmt_01.size_ = 0xd;
        fmt_01.data_ = (char *)0x25;
        args_01.field_1.args_ = in_R9.args_;
        args_01.desc_ = (unsigned_long_long)&local_178;
        ::fmt::v11::vformat_abi_cxx11_
                  ((string *)local_140,(v11 *)"invalid value for timing option: \'{}\'",fmt_01,
                   args_01);
        printError(this,(string *)local_140);
        goto LAB_0064b66f;
      }
    }
    poVar1 = &(this->options).diagHierarchy;
    if ((((this->options).diagHierarchy.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged != true) ||
        (iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)poVar1
                         ,"always"), in_RDX = extraout_RDX_08, iVar7 == 0)) ||
       ((((this->options).diagHierarchy.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged == true &&
         (iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          poVar1,"never"), in_RDX = extraout_RDX_09, iVar7 == 0)) ||
        (((this->options).diagHierarchy.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged == true &&
         (iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          poVar1,"auto"), in_RDX = extraout_RDX_10, iVar7 == 0)))))) {
      if ((((this->options).librariesInheritMacros.super__Optional_base<bool,_true,_true>._M_payload
            .super__Optional_payload_base<bool>._M_engaged == true) &&
          ((this->options).librariesInheritMacros.super__Optional_base<bool,_true,_true>._M_payload.
           super__Optional_payload_base<bool>._M_payload._M_value != false)) &&
         (((this->options).singleUnit.super__Optional_base<bool,_true,_true>._M_payload.
           super__Optional_payload_base<bool>._M_engaged != true ||
          (((this->options).singleUnit.super__Optional_base<bool,_true,_true>._M_payload.
            super__Optional_payload_base<bool>._M_payload._M_value & 1U) == 0)))) {
        local_140._0_8_ = local_130;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_140,
                   "--single-unit must be set when --libraries-inherit-macros is used","");
        printError(this,(string *)local_140);
      }
      else {
        if (((this->options).timeScale.
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_engaged == true) &&
           (str._M_str = in_RDX,
           str._M_len = (size_t)(this->options).timeScale.
                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                ._M_payload.
                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ._M_payload._M_value._M_dataplus._M_p,
           oVar10 = TimeScale::fromString
                              (*(TimeScale **)
                                ((long)&(this->options).timeScale.
                                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                        ._M_payload.
                                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                        .
                                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ._M_payload + 8),str),
           ((uint5)oVar10.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                   super__Optional_payload_base<slang::TimeScale> & 0x100000000) == 0)) {
          local_178.
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)(this->options).timeScale.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._M_value._M_dataplus._M_p;
          local_178.
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               *(pointer *)
                ((long)&(this->options).timeScale.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload + 8);
          fmt_03.size_ = 0xd;
          fmt_03.data_ = (char *)0x29;
          args_03.field_1.args_ = in_R9.args_;
          args_03.desc_ = (unsigned_long_long)&local_178;
          ::fmt::v11::vformat_abi_cxx11_
                    ((string *)local_140,(v11 *)"invalid value for time scale option: \'{}\'",fmt_03
                     ,args_03);
          printError(this,(string *)local_140);
          goto LAB_0064b66f;
        }
        this_02 = &(this->options).compilationFlags;
        local_140._0_4_ = 0x40;
        local_158 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01;
        local_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)poVar1;
        pmVar11 = std::
                  map<slang::ast::CompilationFlags,_std::optional<bool>,_std::less<slang::ast::CompilationFlags>,_std::allocator<std::pair<const_slang::ast::CompilationFlags,_std::optional<bool>_>_>_>
                  ::at(this_02,(key_type *)local_140);
        if (((pmVar11->super__Optional_base<bool,_true,_true>)._M_payload.
             super__Optional_payload_base<bool>._M_engaged == true) &&
           ((pmVar11->super__Optional_base<bool,_true,_true>)._M_payload.
            super__Optional_payload_base<bool>._M_payload._M_value != false)) {
          local_140._0_4_ = 0x80;
          pmVar11 = std::
                    map<slang::ast::CompilationFlags,_std::optional<bool>,_std::less<slang::ast::CompilationFlags>,_std::allocator<std::pair<const_slang::ast::CompilationFlags,_std::optional<bool>_>_>_>
                    ::at(this_02,(key_type *)local_140);
          if ((pmVar11->super__Optional_base<bool,_true,_true>)._M_payload.
              super__Optional_payload_base<bool>._M_engaged == false) {
            (pmVar11->super__Optional_base<bool,_true,_true>)._M_payload.
            super__Optional_payload_base<bool> = (_Optional_payload_base<bool>)0x101;
          }
        }
        pbVar17 = (this->options).translateOffOptions.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar3 = (this->options).translateOffOptions.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar17 != pbVar3) {
          local_148 = (vector<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>>
                       *)&this->translateOffFormats;
          bVar5 = false;
          do {
            str_00._M_str = (char *)0x2c;
            str_00._M_len = (size_t)(pbVar17->_M_dataplus)._M_p;
            splitString(&local_178,(slang *)pbVar17->_M_string_length,str_00,(char)in_R8);
            bVar18 = (long)local_178.
                           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_178.
                           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start != 0x30;
            for (pbVar14 = local_178.
                           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                local_178.
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish != pbVar14; pbVar14 = pbVar14 + 1) {
              if ((pointer *)pbVar14->_M_len == (pointer *)0x0) {
                bVar18 = true;
              }
              else {
                in_R8 = (pointer *)0x0;
                do {
                  cVar2 = pbVar14->_M_str[(long)in_R8];
                  in_R9._0_1_ = cVar2;
                  bVar4 = true;
                  if (((byte)(cVar2 + 0x9fU) < 0x1a || (byte)(cVar2 - 0x30U) < 10) ||
                      (byte)(cVar2 + 0xbfU) < 0x1a) {
                    bVar4 = bVar18;
                  }
                  if (cVar2 == '_') {
                    bVar4 = bVar18;
                  }
                  bVar18 = bVar4;
                  in_R8 = (pointer *)((long)in_R8 + 1);
                } while ((pointer *)pbVar14->_M_len != in_R8);
              }
            }
            if (bVar18) {
              local_48 = (pbVar17->_M_dataplus)._M_p;
              sStack_40 = pbVar17->_M_string_length;
              in_R8 = &local_48;
              fmt_04.size_ = 0xd;
              fmt_04.data_ = (char *)0x2d;
              args_04.field_1.args_ = in_R9.args_;
              args_04.desc_ = (unsigned_long_long)in_R8;
              ::fmt::v11::vformat_abi_cxx11_
                        ((string *)local_140,
                         (v11 *)"invalid format for translate-off-format: \'{}\'",fmt_04,args_04);
              printError(this,(string *)local_140);
              if ((Diagnostic *)local_140._0_8_ != local_130) {
                operator_delete((void *)local_140._0_8_,
                                (long)local_130[0].args.
                                      super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1);
              }
            }
            else {
              std::
              vector<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>>
              ::
              emplace_back<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                        (local_148,
                         local_178.
                         super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         local_178.
                         super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1,
                         local_178.
                         super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 2);
            }
            if (local_178.
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                (basic_string_view<char,_std::char_traits<char>_> *)0x0) {
              operator_delete(local_178.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_178.
                                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_178.
                                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            bVar5 = (bool)(bVar5 | bVar18);
            pbVar17 = pbVar17 + 1;
          } while (pbVar17 != pbVar3);
          if (bVar5) {
            return false;
          }
        }
        pbVar17 = (this->sourceLoader).errors.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar3 = (this->sourceLoader).errors.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        message = pbVar17;
        if (pbVar3 != pbVar17) {
          do {
            printError(this,message);
            message = message + 1;
          } while (message != pbVar3);
          if (pbVar3 != pbVar17) {
            return false;
          }
        }
        this_06 = local_150;
        if ((this->sourceLoader).fileEntries.
            super__Vector_base<slang::driver::SourceLoader::FileEntry,_std::allocator<slang::driver::SourceLoader::FileEntry>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (this->sourceLoader).fileEntries.
            super__Vector_base<slang::driver::SourceLoader::FileEntry,_std::allocator<slang::driver::SourceLoader::FileEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if ((this->options).diagJson.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged == true) {
            pJVar12 = (JsonWriter *)operator_new(0x18);
            JsonWriter::JsonWriter(pJVar12);
            local_140._0_8_ = (pointer)0x0;
            std::__uniq_ptr_impl<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_>::reset
                      ((__uniq_ptr_impl<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_>
                        *)&this->jsonWriter,pJVar12);
            std::unique_ptr<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_>::~unique_ptr
                      ((unique_ptr<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_> *)
                       local_140);
            pJVar12 = (this->jsonWriter)._M_t.
                      super___uniq_ptr_impl<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_slang::JsonWriter_*,_std::default_delete<slang::JsonWriter>_>
                      .super__Head_base<0UL,_slang::JsonWriter_*,_false>._M_head_impl;
            pJVar12->pretty = true;
            JsonWriter::startArray(pJVar12);
            pJVar12 = (this->jsonWriter)._M_t.
                      super___uniq_ptr_impl<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_slang::JsonWriter_*,_std::default_delete<slang::JsonWriter>_>
                      .super__Head_base<0UL,_slang::JsonWriter_*,_false>._M_head_impl;
            p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
            p_Var13->_M_use_count = 1;
            p_Var13->_M_weak_count = 1;
            p_Var13->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00cb5370;
            p_Var13[1]._M_use_count = 0;
            p_Var13[1]._M_weak_count = 0;
            p_Var13[2]._vptr__Sp_counted_base = (_func_int **)0x0;
            *(undefined1 *)&p_Var13[2]._M_use_count = 0;
            p_Var13[1]._vptr__Sp_counted_base = (_func_int **)&PTR__DiagnosticClient_00cc30d8;
            p_Var13[3]._vptr__Sp_counted_base = (_func_int **)pJVar12;
            (this->jsonDiagClient).
            super___shared_ptr<slang::JsonDiagnosticClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)(p_Var13 + 1);
            this_04 = (this->jsonDiagClient).
                      super___shared_ptr<slang::JsonDiagnosticClient,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
            (this->jsonDiagClient).
            super___shared_ptr<slang::JsonDiagnosticClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = p_Var13;
            if (this_04 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_04);
            }
            local_140._0_8_ =
                 (this->jsonDiagClient).
                 super___shared_ptr<slang::JsonDiagnosticClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            *(char *)&(((Diagnostic *)local_140._0_8_)->ranges).
                      super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
                      _M_impl.super__Vector_impl_data._M_start =
                 (this->options).diagAbsPaths.super__Optional_base<bool,_true,_true>._M_payload.
                 super__Optional_payload_base<bool>._M_engaged &
                 (this->options).diagAbsPaths.super__Optional_base<bool,_true,_true>._M_payload.
                 super__Optional_payload_base<bool>._M_payload._M_value;
            local_140._8_8_ =
                 (this->jsonDiagClient).
                 super___shared_ptr<slang::JsonDiagnosticClient,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._8_8_)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._8_8_)->_M_use_count
                     + 1;
                UNLOCK();
              }
              else {
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._8_8_)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._8_8_)->_M_use_count
                     + 1;
              }
            }
            DiagnosticEngine::addClient
                      (&this->diagEngine,(shared_ptr<slang::DiagnosticClient> *)local_140);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._8_8_);
            }
          }
          this_05 = (this->textDiagClient).
                    super___shared_ptr<slang::TextDiagnosticClient,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          TextDiagnosticClient::showColors(this_05,bVar6);
          bVar6 = (bool)((this->options).diagColumn.super__Optional_base<bool,_true,_true>.
                         _M_payload.super__Optional_payload_base<bool>._M_payload._M_value & 1);
          SVar15 = Always;
          if ((this->options).diagColumn.super__Optional_base<bool,_true,_true>._M_payload.
              super__Optional_payload_base<bool>._M_engaged == false) {
            bVar6 = true;
          }
          this_05->includeColumn = bVar6;
          bVar6 = (bool)((this->options).diagLocation.super__Optional_base<bool,_true,_true>.
                         _M_payload.super__Optional_payload_base<bool>._M_payload._M_value & 1);
          if ((this->options).diagLocation.super__Optional_base<bool,_true,_true>._M_payload.
              super__Optional_payload_base<bool>._M_engaged == false) {
            bVar6 = true;
          }
          this_05->includeLocation = bVar6;
          bVar6 = (bool)((this->options).diagSourceLine.super__Optional_base<bool,_true,_true>.
                         _M_payload.super__Optional_payload_base<bool>._M_payload._M_value & 1);
          if ((this->options).diagSourceLine.super__Optional_base<bool,_true,_true>._M_payload.
              super__Optional_payload_base<bool>._M_engaged == false) {
            bVar6 = true;
          }
          this_05->includeSource = bVar6;
          bVar6 = (bool)((this->options).diagOptionName.super__Optional_base<bool,_true,_true>.
                         _M_payload.super__Optional_payload_base<bool>._M_payload._M_value & 1);
          if ((this->options).diagOptionName.super__Optional_base<bool,_true,_true>._M_payload.
              super__Optional_payload_base<bool>._M_engaged == false) {
            bVar6 = true;
          }
          this_05->includeOptionName = bVar6;
          bVar6 = (bool)((this->options).diagIncludeStack.super__Optional_base<bool,_true,_true>.
                         _M_payload.super__Optional_payload_base<bool>._M_payload._M_value & 1);
          if ((this->options).diagIncludeStack.super__Optional_base<bool,_true,_true>._M_payload.
              super__Optional_payload_base<bool>._M_engaged == false) {
            bVar6 = true;
          }
          this_05->includeFileStack = bVar6;
          bVar6 = (bool)((this->options).diagMacroExpansion.super__Optional_base<bool,_true,_true>.
                         _M_payload.super__Optional_payload_base<bool>._M_payload._M_value & 1);
          if ((this->options).diagMacroExpansion.super__Optional_base<bool,_true,_true>._M_payload.
              super__Optional_payload_base<bool>._M_engaged == false) {
            bVar6 = true;
          }
          this_05->includeExpansion = bVar6;
          (this_05->super_DiagnosticClient).absPaths =
               (bool)((this->options).diagAbsPaths.super__Optional_base<bool,_true,_true>._M_payload
                      .super__Optional_payload_base<bool>._M_engaged &
                     (this->options).diagAbsPaths.super__Optional_base<bool,_true,_true>._M_payload.
                     super__Optional_payload_base<bool>._M_payload._M_value);
          if (((this->options).diagHierarchy.
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_engaged != true) ||
             (iVar7 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                (this_06,"always"), iVar7 != 0)) {
            this_07 = local_158;
            if (((this->options).diagHierarchy.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_engaged != true) ||
               (iVar7 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  (this_06,"never"), iVar7 != 0)) goto LAB_0064bb5b;
            SVar15 = Never;
          }
          this_05->includeHierarchy = SVar15;
          this_07 = local_158;
LAB_0064bb5b:
          this_03 = &this->diagEngine;
          _Var9._M_value = 0x14;
          if ((this->options).errorLimit.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_engaged != false) {
            _Var9 = (this->options).errorLimit.super__Optional_base<unsigned_int,_true,_true>.
                    _M_payload.super__Optional_payload_base<unsigned_int>._M_payload;
          }
          (this->diagEngine).errorLimit = (int)_Var9;
          DiagnosticEngine::setDefaultWarnings(this_03);
          DiagnosticEngine::setSeverity(this_03,(DiagCode)0x40000a,Error);
          DiagnosticEngine::setSeverity(this_03,(DiagCode)0x550008,Error);
          DiagnosticEngine::setSeverity(this_03,(DiagCode)0x42000a,Error);
          if (((this->options).compat.
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_engaged == true) &&
             (iVar7 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                (this_07,"vcs"), iVar7 == 0)) {
            DiagnosticEngine::setSeverity(this_03,(DiagCode)0xf90006,Ignored);
            DiagnosticEngine::setSeverity(this_03,(DiagCode)0xc30007,Ignored);
            DiagnosticEngine::setSeverity(this_03,(DiagCode)0x2b000b,Ignored);
            DiagnosticEngine::setSeverity(this_03,(DiagCode)0x30000b,Ignored);
            DiagnosticEngine::setSeverity(this_03,(DiagCode)0xc90005,Ignored);
            code.subsystem = Parser;
            code.code = 200;
            severity = Ignored;
          }
          else {
            DiagnosticEngine::setSeverity(this_03,(DiagCode)0xc40007,Error);
            DiagnosticEngine::setSeverity(this_03,(DiagCode)0xd00007,Error);
            DiagnosticEngine::setSeverity(this_03,(DiagCode)0xd10007,Error);
            DiagnosticEngine::setSeverity(this_03,(DiagCode)0xf00006,Error);
            DiagnosticEngine::setSeverity(this_03,(DiagCode)0xca0005,Error);
            DiagnosticEngine::setSeverity(this_03,(DiagCode)0xc30005,Error);
            code.subsystem = Expressions;
            code.code = 0xd6;
            severity = Error;
          }
          DiagnosticEngine::setSeverity(this_03,code,severity);
          pbVar17 = (this->options).warningOptions.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          options._M_extent._M_extent_value =
               (long)(this->options).warningOptions.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar17 >> 5;
          options._M_ptr = pbVar17;
          ctx = (Diagnostic *)this_03;
          DiagnosticEngine::setWarningOptions((Diagnostics *)local_140,this_03,options);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            lVar16 = local_140._8_8_ * 0x70;
            diagnostic = (Diagnostic *)local_140._0_8_;
            do {
              ctx = diagnostic;
              DiagnosticEngine::issue(this_03,diagnostic);
              diagnostic = diagnostic + 1;
              lVar16 = lVar16 + -0x70;
            } while (lVar16 != 0);
          }
          SmallVectorBase<slang::Diagnostic>::cleanup
                    ((SmallVectorBase<slang::Diagnostic> *)local_140,(EVP_PKEY_CTX *)ctx);
          return true;
        }
        local_140._0_8_ = local_130;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"no input files","");
        printError(this,(string *)local_140);
      }
      if ((Diagnostic *)local_140._0_8_ == local_130) {
        return false;
      }
      goto LAB_0064b67d;
    }
    local_178.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)(this->options).diagHierarchy.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_payload._M_value._M_dataplus._M_p;
    local_178.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         *(pointer *)
          ((long)&(this->options).diagHierarchy.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_payload + 8);
    fmt_02.size_ = 0xd;
    fmt_02.data_ = (char *)0x2d;
    args_02.field_1.values_ = in_R9.values_;
    args_02.desc_ = (unsigned_long_long)&local_178;
    ::fmt::v11::vformat_abi_cxx11_
              ((string *)local_140,(v11 *)"invalid value for diag-hierarchy option: \'{}\'",fmt_02,
               args_02);
    printError(this,(string *)local_140);
  }
LAB_0064b66f:
  if ((Diagnostic *)local_140._0_8_ == local_130) {
    return false;
  }
LAB_0064b67d:
  operator_delete((void *)local_140._0_8_,
                  (long)local_130[0].args.
                        super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1);
  return false;
}

Assistant:

bool Driver::processOptions() {
    bool showColors;
    if (options.colorDiags.has_value())
        showColors = *options.colorDiags;
    else
        showColors = OS::fileSupportsColors(stderr);

    if (showColors) {
        OS::setStderrColorsEnabled(true);
        if (OS::fileSupportsColors(stdout))
            OS::setStdoutColorsEnabled(true);
    }

    if (options.languageVersion.has_value()) {
        if (options.languageVersion == "1800-2017")
            languageVersion = LanguageVersion::v1800_2017;
        else if (options.languageVersion == "1800-2023" || options.languageVersion == "latest")
            languageVersion = LanguageVersion::v1800_2023;
        else {
            printError(
                fmt::format("invalid value for --std option: '{}'", *options.languageVersion));
            return false;
        }
    }

    if (options.compat.has_value()) {
        if (options.compat == "vcs") {
            auto vcsCompatFlags = {CompilationFlags::AllowHierarchicalConst,
                                   CompilationFlags::AllowUseBeforeDeclare,
                                   CompilationFlags::RelaxEnumConversions,
                                   CompilationFlags::RelaxStringConversions,
                                   CompilationFlags::AllowRecursiveImplicitCall,
                                   CompilationFlags::AllowBareValParamAssignment,
                                   CompilationFlags::AllowSelfDeterminedStreamConcat,
                                   CompilationFlags::AllowMultiDrivenLocals,
                                   CompilationFlags::AllowMergingAnsiPorts};

            for (auto flag : vcsCompatFlags) {
                auto& option = options.compilationFlags.at(flag);
                if (!option.has_value())
                    option = true;
            }
        }
        else {
            printError(fmt::format("invalid value for compat option: '{}'", *options.compat));
            return false;
        }
    }

    if (options.minTypMax.has_value() && options.minTypMax != "min" && options.minTypMax != "typ" &&
        options.minTypMax != "max") {
        printError(fmt::format("invalid value for timing option: '{}'", *options.minTypMax));
        return false;
    }

    if (options.diagHierarchy.has_value() && options.diagHierarchy != "always" &&
        options.diagHierarchy != "never" && options.diagHierarchy != "auto") {
        printError(
            fmt::format("invalid value for diag-hierarchy option: '{}'", *options.diagHierarchy));
        return false;
    }

    if (options.librariesInheritMacros == true && !options.singleUnit.value_or(false)) {
        printError("--single-unit must be set when --libraries-inherit-macros is used");
        return false;
    }

    if (options.timeScale.has_value() && !TimeScale::fromString(*options.timeScale)) {
        printError(fmt::format("invalid value for time scale option: '{}'", *options.timeScale));
        return false;
    }

    if (options.lintMode()) {
        auto& opt = options.compilationFlags.at(CompilationFlags::IgnoreUnknownModules);
        if (!opt.has_value())
            opt = true;
    }

    if (!options.translateOffOptions.empty()) {
        bool anyBad = false;
        for (auto& fmtStr : options.translateOffOptions) {
            bool bad = false;
            auto parts = splitString(fmtStr, ',');
            if (parts.size() != 3)
                bad = true;

            for (auto part : parts) {
                if (part.empty())
                    bad = true;

                for (char c : part) {
                    if (!isAlphaNumeric(c) && c != '_')
                        bad = true;
                }
            }

            if (bad)
                printError(fmt::format("invalid format for translate-off-format: '{}'", fmtStr));
            else
                translateOffFormats.emplace_back(parts[0], parts[1], parts[2]);

            anyBad |= bad;
        }

        if (anyBad)
            return false;
    }

    if (!reportLoadErrors())
        return false;

    if (!sourceLoader.hasFiles()) {
        printError("no input files");
        return false;
    }

    if (options.diagJson.has_value()) {
        jsonWriter = std::make_unique<JsonWriter>();
        jsonWriter->setPrettyPrint(true);
        jsonWriter->startArray();

        jsonDiagClient = std::make_shared<JsonDiagnosticClient>(*jsonWriter);
        jsonDiagClient->showAbsPaths(options.diagAbsPaths.value_or(false));
        diagEngine.addClient(jsonDiagClient);
    }

    auto& tdc = *textDiagClient;
    tdc.showColors(showColors);
    tdc.showColumn(options.diagColumn.value_or(true));
    tdc.showLocation(options.diagLocation.value_or(true));
    tdc.showSourceLine(options.diagSourceLine.value_or(true));
    tdc.showOptionName(options.diagOptionName.value_or(true));
    tdc.showIncludeStack(options.diagIncludeStack.value_or(true));
    tdc.showMacroExpansion(options.diagMacroExpansion.value_or(true));
    tdc.showAbsPaths(options.diagAbsPaths.value_or(false));

    if (options.diagHierarchy == "always")
        tdc.showHierarchyInstance(ShowHierarchyPathOption::Always);
    else if (options.diagHierarchy == "never")
        tdc.showHierarchyInstance(ShowHierarchyPathOption::Never);

    diagEngine.setErrorLimit((int)options.errorLimit.value_or(20));
    diagEngine.setDefaultWarnings();

    // Some tools violate the standard in various ways, but in order to allow
    // compatibility with these tools we change the respective errors into a
    // suppressible warning that we promote to an error by default. This allows
    // the user to turn this back into a warning, or turn it off altogether.

    diagEngine.setSeverity(diag::DuplicateDefinition, DiagnosticSeverity::Error);
    diagEngine.setSeverity(diag::BadProceduralForce, DiagnosticSeverity::Error);
    diagEngine.setSeverity(diag::UnknownSystemName, DiagnosticSeverity::Error);

    if (options.compat == "vcs") {
        diagEngine.setSeverity(diag::StaticInitializerMustBeExplicit, DiagnosticSeverity::Ignored);
        diagEngine.setSeverity(diag::ImplicitConvert, DiagnosticSeverity::Ignored);
        diagEngine.setSeverity(diag::BadFinishNum, DiagnosticSeverity::Ignored);
        diagEngine.setSeverity(diag::NonstandardSysFunc, DiagnosticSeverity::Ignored);
        diagEngine.setSeverity(diag::NonstandardForeach, DiagnosticSeverity::Ignored);
        diagEngine.setSeverity(diag::NonstandardDist, DiagnosticSeverity::Ignored);
    }
    else {
        // These warnings are set to Error severity by default, unless we're in vcs compat mode.
        // The user can always downgrade via warning options, which get set after this.
        diagEngine.setSeverity(diag::IndexOOB, DiagnosticSeverity::Error);
        diagEngine.setSeverity(diag::RangeOOB, DiagnosticSeverity::Error);
        diagEngine.setSeverity(diag::RangeWidthOOB, DiagnosticSeverity::Error);
        diagEngine.setSeverity(diag::ImplicitNamedPortTypeMismatch, DiagnosticSeverity::Error);
        diagEngine.setSeverity(diag::SplitDistWeightOp, DiagnosticSeverity::Error);
        diagEngine.setSeverity(diag::DPIPureTask, DiagnosticSeverity::Error);
        diagEngine.setSeverity(diag::SpecifyPathConditionExpr, DiagnosticSeverity::Error);
    }

    Diagnostics optionDiags = diagEngine.setWarningOptions(options.warningOptions);
    for (auto& diag : optionDiags)
        diagEngine.issue(diag);

    return true;
}